

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomPoints>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomPoints *points
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr prop_name;
  size_type *psVar1;
  string *this;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  long *plVar5;
  const_iterator cVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  size_type *psVar9;
  _Rb_tree_header *p_Var10;
  Property *pPVar11;
  bool bVar12;
  int iVar13;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  undefined4 in_stack_fffffffffffffcac;
  string local_350;
  string *local_330;
  long *local_328 [2];
  long local_318 [2];
  undefined1 local_308 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f0;
  _Base_ptr local_2e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_2d8;
  string *local_2d0;
  string *local_2c8;
  string *local_2c0;
  string *local_2b8;
  string *local_2b0;
  _Base_ptr local_2a8;
  string *local_2a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [376];
  
  local_298._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_298._M_t._M_impl.super__Rb_tree_header._M_header;
  local_298._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar12 = false;
  local_298._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_298._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar3 = (uint)options->strict_allowedToken_check;
  local_298._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_298._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&local_298,properties,&points->super_GPrim,warn,err,
                     options->strict_allowedToken_check);
  if (bVar2) {
    p_Var8 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var10 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar12 = true;
    if ((_Rb_tree_header *)p_Var8 != p_Var10) {
      local_2a0 = (string *)&points->points;
      local_2b0 = (string *)&points->normals;
      local_2b8 = (string *)&points->widths;
      local_2c0 = (string *)&points->ids;
      local_2c8 = (string *)&points->velocities;
      local_2d0 = (string *)&points->accelerations;
      local_2d8 = &(points->super_GPrim).props;
      local_330 = err;
      local_2a8 = &p_Var10->_M_header;
      do {
        local_1c8[0] = local_1b8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1c8,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        prop_name = p_Var8 + 2;
        local_1a8._0_8_ = local_1a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"points","");
        pPVar11 = (Property *)local_1a8;
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                  ((ParseResult *)local_308,(_anonymous_namespace_ *)&local_298,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c8,(string *)prop_name,(Property *)local_1a8,local_2a0,
                   (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffcac,uVar3));
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        iVar13 = 0;
        if ((local_308._0_8_ & 0xfffffffd) == 0) {
          iVar13 = 3;
LAB_00211e8d:
          bVar2 = false;
        }
        else {
          bVar2 = true;
          if (local_308._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd88);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            local_328[0] = local_318;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[7],std::__cxx11::string>
                      (&local_350,(fmt *)local_328,(string *)"points",(char (*) [7])(local_308 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar11)
            ;
            poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_350._M_dataplus._M_p,
                                local_350._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_328[0] != local_318) {
              operator_delete(local_328[0],local_318[0] + 1);
            }
            if (local_330 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar5 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_328,(ulong)(local_330->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_350.field_2._M_allocated_capacity = *psVar1;
                local_350.field_2._8_8_ = plVar5[3];
                local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
              }
              else {
                local_350.field_2._M_allocated_capacity = *psVar1;
                local_350._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_350._M_string_length = plVar5[1];
              *plVar5 = (long)psVar1;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_330,(string *)&local_350);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
              if (local_328[0] != local_318) {
                operator_delete(local_328[0],local_318[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
            iVar13 = 1;
            goto LAB_00211e8d;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._8_8_ != &aStack_2f0) {
          operator_delete((void *)local_308._8_8_,aStack_2f0._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_1e8[0] = local_1d8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e8,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"normals","");
          pPVar11 = (Property *)local_1a8;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                    ((ParseResult *)local_308,(_anonymous_namespace_ *)&local_298,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1e8,(string *)prop_name,(Property *)local_1a8,local_2b0,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffcac,uVar3));
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (local_1e8[0] != local_1d8) {
            operator_delete(local_1e8[0],local_1d8[0] + 1);
          }
          iVar13 = 0;
          if ((local_308._0_8_ & 0xfffffffd) == 0) {
            iVar13 = 3;
LAB_00212189:
            bVar2 = false;
          }
          else {
            bVar2 = true;
            if (local_308._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd89);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              local_328[0] = local_318;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_328,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[8],std::__cxx11::string>
                        (&local_350,(fmt *)local_328,(string *)"normals",
                         (char (*) [8])(local_308 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar11);
              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_350._M_dataplus._M_p,
                                  local_350._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
              if (local_328[0] != local_318) {
                operator_delete(local_328[0],local_318[0] + 1);
              }
              if (local_330 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar5 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_328,(ulong)(local_330->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350.field_2._8_8_ = plVar5[3];
                  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                }
                else {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_350._M_string_length = plVar5[1];
                *plVar5 = (long)psVar1;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_330,(string *)&local_350);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p,
                                  local_350.field_2._M_allocated_capacity + 1);
                }
                if (local_328[0] != local_318) {
                  operator_delete(local_328[0],local_318[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              iVar13 = 1;
              goto LAB_00212189;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._8_8_ != &aStack_2f0) {
            operator_delete((void *)local_308._8_8_,aStack_2f0._M_allocated_capacity + 1);
          }
          if (!bVar2) goto LAB_00212f21;
          local_208[0] = local_1f8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_208,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"widths","");
          pPVar11 = (Property *)local_1a8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                    ((ParseResult *)local_308,(_anonymous_namespace_ *)&local_298,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_208,(string *)prop_name,(Property *)local_1a8,local_2b8,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffcac,uVar3));
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (local_208[0] != local_1f8) {
            operator_delete(local_208[0],local_1f8[0] + 1);
          }
          iVar13 = 0;
          if ((local_308._0_8_ & 0xfffffffd) == 0) {
            iVar13 = 3;
LAB_00212485:
            bVar2 = false;
          }
          else {
            bVar2 = true;
            if (local_308._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd8a);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              local_328[0] = local_318;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_328,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        (&local_350,(fmt *)local_328,(string *)"widths",
                         (char (*) [7])(local_308 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar11);
              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_350._M_dataplus._M_p,
                                  local_350._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
              if (local_328[0] != local_318) {
                operator_delete(local_328[0],local_318[0] + 1);
              }
              if (local_330 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar5 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_328,(ulong)(local_330->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350.field_2._8_8_ = plVar5[3];
                  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                }
                else {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_350._M_string_length = plVar5[1];
                *plVar5 = (long)psVar1;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_330,(string *)&local_350);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p,
                                  local_350.field_2._M_allocated_capacity + 1);
                }
                if (local_328[0] != local_318) {
                  operator_delete(local_328[0],local_318[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              iVar13 = 1;
              goto LAB_00212485;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._8_8_ != &aStack_2f0) {
            operator_delete((void *)local_308._8_8_,aStack_2f0._M_allocated_capacity + 1);
          }
          if (!bVar2) goto LAB_00212f21;
          local_228[0] = local_218;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_228,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ids","");
          pPVar11 = (Property *)local_1a8;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<long,std::allocator<long>>>
                    ((ParseResult *)local_308,(_anonymous_namespace_ *)&local_298,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_228,(string *)prop_name,(Property *)local_1a8,local_2c0,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<long,_std::allocator<long>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffcac,uVar3));
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (local_228[0] != local_218) {
            operator_delete(local_228[0],local_218[0] + 1);
          }
          iVar13 = 0;
          if ((local_308._0_8_ & 0xfffffffd) == 0) {
            iVar13 = 3;
LAB_00212781:
            bVar2 = false;
          }
          else {
            bVar2 = true;
            if (local_308._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd8b);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              local_328[0] = local_318;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_328,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[4],std::__cxx11::string>
                        (&local_350,(fmt *)local_328,(string *)"ids",(char (*) [4])(local_308 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar11);
              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_350._M_dataplus._M_p,
                                  local_350._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
              if (local_328[0] != local_318) {
                operator_delete(local_328[0],local_318[0] + 1);
              }
              if (local_330 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar5 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_328,(ulong)(local_330->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350.field_2._8_8_ = plVar5[3];
                  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                }
                else {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_350._M_string_length = plVar5[1];
                *plVar5 = (long)psVar1;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_330,(string *)&local_350);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p,
                                  local_350.field_2._M_allocated_capacity + 1);
                }
                if (local_328[0] != local_318) {
                  operator_delete(local_328[0],local_318[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              iVar13 = 1;
              goto LAB_00212781;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._8_8_ != &aStack_2f0) {
            operator_delete((void *)local_308._8_8_,aStack_2f0._M_allocated_capacity + 1);
          }
          if (!bVar2) goto LAB_00212f21;
          local_248[0] = local_238;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_248,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"velocities","");
          pPVar11 = (Property *)local_1a8;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                    ((ParseResult *)local_308,(_anonymous_namespace_ *)&local_298,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_248,(string *)prop_name,(Property *)local_1a8,local_2c8,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffcac,uVar3));
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (local_248[0] != local_238) {
            operator_delete(local_248[0],local_238[0] + 1);
          }
          iVar13 = 0;
          if ((local_308._0_8_ & 0xfffffffd) == 0) {
            iVar13 = 3;
LAB_00212a7d:
            bVar2 = false;
          }
          else {
            bVar2 = true;
            if (local_308._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd8c);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              local_328[0] = local_318;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_328,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[11],std::__cxx11::string>
                        (&local_350,(fmt *)local_328,(string *)"velocities",
                         (char (*) [11])(local_308 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar11);
              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_350._M_dataplus._M_p,
                                  local_350._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
              if (local_328[0] != local_318) {
                operator_delete(local_328[0],local_318[0] + 1);
              }
              if (local_330 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar5 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_328,(ulong)(local_330->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350.field_2._8_8_ = plVar5[3];
                  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                }
                else {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_350._M_string_length = plVar5[1];
                *plVar5 = (long)psVar1;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_330,(string *)&local_350);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p,
                                  local_350.field_2._M_allocated_capacity + 1);
                }
                if (local_328[0] != local_318) {
                  operator_delete(local_328[0],local_318[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              iVar13 = 1;
              goto LAB_00212a7d;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._8_8_ != &aStack_2f0) {
            operator_delete((void *)local_308._8_8_,aStack_2f0._M_allocated_capacity + 1);
          }
          if (!bVar2) goto LAB_00212f21;
          local_268[0] = local_258;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_268,*(long *)(p_Var8 + 1),
                     (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
          local_1a8._0_8_ = local_1a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"accelerations","");
          pPVar11 = (Property *)local_1a8;
          (anonymous_namespace)::
          ParseTypedAttribute<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                    ((ParseResult *)local_308,(_anonymous_namespace_ *)&local_298,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_268,(string *)prop_name,(Property *)local_1a8,local_2d0,
                     (TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffcac,uVar3));
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if (local_268[0] != local_258) {
            operator_delete(local_268[0],local_258[0] + 1);
          }
          iVar13 = 0;
          if ((local_308._0_8_ & 0xfffffffd) == 0) {
            iVar13 = 3;
LAB_00212d79:
            bVar2 = false;
          }
          else {
            bVar2 = true;
            if (local_308._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar4 = (ostream *)::std::ostream::operator<<((Property *)local_1a8,0xd8d);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
              local_328[0] = local_318;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_328,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        (&local_350,(fmt *)local_328,(string *)"accelerations",
                         (char (*) [14])(local_308 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar11);
              poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_350._M_dataplus._M_p,
                                  local_350._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
              if (local_328[0] != local_318) {
                operator_delete(local_328[0],local_318[0] + 1);
              }
              if (local_330 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar5 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_328,(ulong)(local_330->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar5 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350.field_2._8_8_ = plVar5[3];
                  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
                }
                else {
                  local_350.field_2._M_allocated_capacity = *psVar1;
                  local_350._M_dataplus._M_p = (pointer)*plVar5;
                }
                local_350._M_string_length = plVar5[1];
                *plVar5 = (long)psVar1;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)local_330,(string *)&local_350);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_350._M_dataplus._M_p != &local_350.field_2) {
                  operator_delete(local_350._M_dataplus._M_p,
                                  local_350.field_2._M_allocated_capacity + 1);
                }
                if (local_328[0] != local_318) {
                  operator_delete(local_328[0],local_318[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              iVar13 = 1;
              goto LAB_00212d79;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._8_8_ != &aStack_2f0) {
            operator_delete((void *)local_308._8_8_,aStack_2f0._M_allocated_capacity + 1);
          }
          if (!bVar2) goto LAB_00212f21;
          local_2e0 = p_Var8 + 1;
          cVar6 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_298,(key_type *)local_2e0);
          p_Var10 = &local_298._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar6._M_node == p_Var10) {
            pmVar7 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     ::operator[](local_2d8,(key_type *)local_2e0);
            ::std::__cxx11::string::_M_assign((string *)pmVar7);
            (pmVar7->_attrib)._varying_authored = (bool)p_Var8[3].field_0x4;
            (pmVar7->_attrib)._variability = p_Var8[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar7->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar7->_attrib)._var,(any *)&p_Var8[4]._M_parent);
            (pmVar7->_attrib)._var._blocked = SUB41(p_Var8[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=(&(pmVar7->_attrib)._var._ts._samples,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var8[5]._M_parent);
            (pmVar7->_attrib)._var._ts._dirty = SUB41(p_Var8[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar7->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var8[6]._M_parent);
            AttrMetas::operator=(&(pmVar7->_attrib)._metas,(AttrMetas *)(p_Var8 + 7));
            *(_Base_ptr *)&pmVar7->_listOpQual = p_Var8[0x17]._M_parent;
            (pmVar7->_rel).type = *(Type *)&p_Var8[0x17]._M_left;
            Path::operator=(&(pmVar7->_rel).targetPath,(Path *)&p_Var8[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &(pmVar7->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var8[0x1e]._M_parent);
            (pmVar7->_rel).listOpQual = p_Var8[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar7->_rel)._metas,(AttrMetas *)&p_Var8[0x1f]._M_parent);
            (pmVar7->_rel)._varying_authored = *(bool *)&p_Var8[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar7->_prop_value_type_name);
            pmVar7->_has_custom = *(bool *)&p_Var8[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e0);
          }
          cVar6 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_298,(key_type *)local_2e0);
          if ((_Rb_tree_header *)cVar6._M_node != p_Var10) goto LAB_00212f30;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0xd8f);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_308,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e0);
          poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_308._0_8_,local_308._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          psVar1 = (size_type *)(local_308 + 0x10);
          if ((size_type *)local_308._0_8_ != psVar1) {
            operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
          }
          this = local_330;
          if (local_330 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar5 = (long *)::std::__cxx11::string::_M_append
                                       ((char *)&local_350,(ulong)(this->_M_dataplus)._M_p);
            psVar9 = (size_type *)(plVar5 + 2);
            if ((size_type *)*plVar5 == psVar9) {
              local_308._16_8_ = *psVar9;
              aStack_2f0._M_allocated_capacity = plVar5[3];
              local_308._0_8_ = psVar1;
            }
            else {
              local_308._16_8_ = *psVar9;
              local_308._0_8_ = (size_type *)*plVar5;
            }
            local_308._8_8_ = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)this,(string *)local_308);
            if ((size_type *)local_308._0_8_ != psVar1) {
              operator_delete((void *)local_308._0_8_,local_308._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
LAB_00213114:
          bVar12 = false;
          goto LAB_00213117;
        }
LAB_00212f21:
        if ((iVar13 != 3) && (iVar13 != 0)) goto LAB_00213114;
LAB_00212f30:
        p_Var8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8);
      } while (p_Var8 != local_2a8);
      bVar12 = true;
    }
  }
LAB_00213117:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_298,
             (_Link_type)local_298._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar12;
}

Assistant:

bool ReconstructPrim<GeomPoints>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomPoints *points,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  DCOUT("Reconstruct Points.");

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, points, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("prop: " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "points", GeomPoints, points->points)
    PARSE_TYPED_ATTRIBUTE(table, prop, "normals", GeomPoints, points->normals)
    PARSE_TYPED_ATTRIBUTE(table, prop, "widths", GeomPoints, points->widths)
    PARSE_TYPED_ATTRIBUTE(table, prop, "ids", GeomPoints, points->ids)
    PARSE_TYPED_ATTRIBUTE(table, prop, "velocities", GeomPoints, points->velocities)
    PARSE_TYPED_ATTRIBUTE(table, prop, "accelerations", GeomPoints, points->accelerations)
    ADD_PROPERTY(table, prop, GeomSphere, points->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}